

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemberDeclaration_Enumerator.h
# Opt level: O3

void __thiscall
psy::C::EnumeratorDeclarationSymbol::~EnumeratorDeclarationSymbol(EnumeratorDeclarationSymbol *this)

{
  MemberDeclarationSymbol::~MemberDeclarationSymbol(&this->super_MemberDeclarationSymbol);
  operator_delete(this,0x20);
  return;
}

Assistant:

class PSY_C_API EnumeratorDeclarationSymbol final : public MemberDeclarationSymbol
{
public:
    //!@{
    /**
     * Cast \c this Symbol as a EnumeratorDeclarationSymbol.
     */
    virtual EnumeratorDeclarationSymbol* asEnumeratorDeclaration() override { return this; }
    virtual const EnumeratorDeclarationSymbol* asEnumeratorDeclaration() const override { return this; }
    //!@}

PSY_INTERNAL:
    PSY_GRANT_INTERNAL_ACCESS(DeclarationBinder);

    EnumeratorDeclarationSymbol(const Symbol* containingSym,
                                const SyntaxTree* tree,
                                const Scope* enclosingScope);
}